

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealwrap.cpp
# Opt level: O3

Url * __thiscall Vault::Sys::Sealwrap::getUrl_abi_cxx11_(Url *__return_storage_ptr__,Sealwrap *this)

{
  long *plVar1;
  long *local_68;
  undefined8 local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  plVar1 = *(long **)this;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/v1/sys/sealwrap/rewrap","");
  local_58[0] = 0;
  local_58[1] = 0;
  local_60 = 0;
  local_68 = local_58;
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,(string *)local_48,&local_68);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::Sealwrap::getUrl() {
  return client_.getUrl("/v1/sys/sealwrap/rewrap", Path{});
}